

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

size_t ByteStreamToBase64(uint8_t *InBuffer,size_t InCount,char *OutBuffer,size_t len)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar6;
  ulong uVar7;
  uchar *ps;
  size_t sVar5;
  
  uVar7 = InCount / 3;
  iVar3 = (int)uVar7;
  iVar4 = iVar3 * 4 + 4;
  if (InCount == uVar7 * 3) {
    iVar4 = iVar3 * 4;
  }
  sVar5 = (size_t)iVar4;
  if (len < sVar5) {
    return 0;
  }
  if (0 < iVar3) {
    do {
      bVar1 = *InBuffer;
      *OutBuffer = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[bVar1 >> 2];
      bVar2 = InBuffer[1];
      OutBuffer[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
                     [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
      bVar1 = InBuffer[2];
      InBuffer = InBuffer + 3;
      OutBuffer[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
                     [(uint)(bVar1 >> 6) + (bVar2 & 0xf) * 4];
      OutBuffer[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
                     [bVar1 & 0x3f];
      OutBuffer = OutBuffer + 4;
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 0);
  }
  if (InCount % 3 == 2) {
    bVar1 = *InBuffer;
    *OutBuffer = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[bVar1 >> 2];
    bVar2 = InBuffer[1];
    OutBuffer[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
                   [(uint)(bVar2 >> 4) | (bVar1 & 3) << 4];
    OutBuffer[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
                   [(ulong)(bVar2 & 0xf) * 4];
  }
  else {
    if (InCount % 3 != 1) {
      return sVar5;
    }
    bVar1 = *InBuffer;
    *OutBuffer = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[bVar1 >> 2];
    OutBuffer[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
                   [(bVar1 & 3) << 4];
    OutBuffer[2] = '=';
  }
  OutBuffer[3] = '=';
  return sVar5;
}

Assistant:

size_t                                /* Number of bytes in the encoded buffer */
	ByteStreamToBase64 (
		    const uint8_t * InBuffer,           /* Input buffer, binary data */
		    size_t    InCount,              /* Number of bytes in the input buffer */
		    char  * OutBuffer,          /* output buffer */
		size_t len			   /* length of output buffer */
	)

	{
		unsigned char * ps;
		unsigned char * pd;
		unsigned char   acc_1;
		unsigned char   acc_2;
		int             i;
		int             n;
		int             m;
		size_t outCount;

		ps = (unsigned char *)InBuffer;
		n = InCount/3;
		m = InCount%3;
		if (!m)
		     outCount = 4*n;
		else
		     outCount = 4*(n+1);
		if (outCount > len) return 0;
		pd = (unsigned char *)OutBuffer;
		for ( i = 0; i<n; i++ ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x30;
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     acc_1 = *ps++;
		     acc_2 |= acc_1 >> 4;      /* base64 digit #2 */
		     *pd++ = T64[acc_2];
		     acc_1 &= 0x0f;
		     acc_1 <<=2;
		     acc_2 = *ps++;
		     acc_1 |= acc_2>>6;        /* base64 digit #3 */
		     *pd++ = T64[acc_1];
		     acc_2 &= 0x3f;            /* base64 digit #4 */
		     *pd++ = T64[acc_2];
		}
		if ( m == 1 ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x3f;  /* base64 digit #2 */
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     *pd++ = T64[acc_2];
		     *pd++ = P64;
		     *pd++ = P64;

		}
		else if ( m == 2 ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x3f;
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     acc_1 = *ps++;
		     acc_2 |= acc_1 >> 4;      /* base64 digit #2 */
		     *pd++ = T64[acc_2];
		     acc_1 &= 0x0f;
		     acc_1 <<=2;               /* base64 digit #3 */
		     *pd++ = T64[acc_1];
		     *pd++ = P64;
		}

		return outCount;
	}